

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::gatherArray2DOffsetsCompare
          (tcu *this,ConstPixelBufferAccess *src,Sampler *sampler,float ref,float s,float t,
          int depth,IVec2 (*offsets) [4])

{
  TextureFormat *format;
  float *pfVar1;
  float fVar2;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  Vec4 VVar5;
  int local_50;
  undefined1 local_4c [4];
  int i;
  Vec4 gathered;
  bool isFixedPoint;
  IVec2 (*offsets_local) [4];
  int depth_local;
  float t_local;
  float s_local;
  float ref_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *src_local;
  Vec4 *result;
  undefined8 uVar4;
  
  unique0x100000b3 = offsets;
  format = ConstPixelBufferAccess::getFormat(src);
  gathered.m_data[2]._3_1_ = isFixedPointDepthTextureFormat(format);
  VVar5 = fetchGatherArray2DOffsets((tcu *)local_4c,src,sampler,s,t,depth,0,stack0xffffffffffffffc8)
  ;
  uVar4 = VVar5.m_data._8_8_;
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
    fVar2 = execCompare((Vec4 *)local_4c,sampler->compare,local_50,ref,
                        (bool)(gathered.m_data[2]._3_1_ & 1));
    pfVar1 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_50);
    uVar3 = (ulong)(uint)fVar2;
    *pfVar1 = fVar2;
  }
  VVar5.m_data[2] = (float)(int)uVar4;
  VVar5.m_data[3] = (float)(int)((ulong)uVar4 >> 0x20);
  VVar5.m_data[0] = (float)(int)uVar3;
  VVar5.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vec4)VVar5.m_data;
}

Assistant:

Vec4 gatherArray2DOffsetsCompare (const ConstPixelBufferAccess& src, const Sampler& sampler, float ref, float s, float t, int depth, const IVec2 (&offsets)[4])
{
	DE_ASSERT(sampler.compare != Sampler::COMPAREMODE_NONE);
	DE_ASSERT(src.getFormat().order == TextureFormat::D || src.getFormat().order == TextureFormat::DS);
	DE_ASSERT(sampler.compareChannel == 0);

	const bool	isFixedPoint	= isFixedPointDepthTextureFormat(src.getFormat());
	const Vec4	gathered		= fetchGatherArray2DOffsets(src, sampler, s, t, depth, 0 /* component 0: depth */, offsets);
	Vec4		result;

	for (int i = 0; i < 4; i++)
		result[i] = execCompare(gathered, sampler.compare, i, ref, isFixedPoint);

	return result;
}